

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O1

gravity_list_t * gravity_list_new(gravity_vm *vm,uint32_t n)

{
  gravity_object_t *obj;
  void *pvVar1;
  
  if (n < 0x400001) {
    obj = (gravity_object_t *)gravity_calloc((gravity_vm *)0x0,1,0x48);
    obj->isa = gravity_class_list;
    obj->objclass = (gravity_class_t *)0x0;
    obj->identifier = (char *)0x0;
    obj->has_outer = false;
    obj->is_struct = false;
    obj->is_inited = false;
    obj->unused = false;
    *(undefined4 *)&obj->field_0x44 = 0;
    obj->identifier = (char *)((ulong)n + 8);
    pvVar1 = malloc((long)((ulong)n + 8) * 0x10);
    *(void **)&obj->has_outer = pvVar1;
    if (vm != (gravity_vm *)0x0) {
      gravity_vm_transfer(vm,obj);
    }
  }
  else {
    obj = (gravity_object_t *)0x0;
  }
  return (gravity_list_t *)obj;
}

Assistant:

gravity_list_t *gravity_list_new (gravity_vm *vm, uint32_t n) {
    if (n > MAX_ALLOCATION) return NULL;

    gravity_list_t *list = (gravity_list_t *)mem_alloc(NULL, sizeof(gravity_list_t));

    list->isa = gravity_class_list;
    marray_init(list->array);
    marray_resize(gravity_value_t, list->array, n + MARRAY_DEFAULT_SIZE);

    if (vm) gravity_vm_transfer(vm, (gravity_object_t*) list);
    return list;
}